

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

ByteData * __thiscall cfd::core::HashUtil::Output(ByteData *__return_storage_ptr__,HashUtil *this)

{
  CfdException *this_00;
  allocator local_121;
  string local_120;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  ByteData256 local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ByteData256 local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData160 local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  ByteData160 local_30;
  HashUtil *local_18;
  HashUtil *this_local;
  
  local_18 = this;
  this_local = (HashUtil *)__return_storage_ptr__;
  switch(this->hash_type_) {
  case '\x01':
    ByteData::GetBytes(&local_48,&this->buffer_);
    Ripemd160(&local_30,&local_48);
    ByteData160::GetData(__return_storage_ptr__,&local_30);
    ByteData160::~ByteData160(&local_30);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    break;
  case '\x02':
    ByteData::GetBytes(&local_88,&this->buffer_);
    Hash160(&local_70,&local_88);
    ByteData160::GetData(__return_storage_ptr__,&local_70);
    ByteData160::~ByteData160(&local_70);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88);
    break;
  case '\x03':
    ByteData::GetBytes(&local_b8,&this->buffer_);
    Sha256(&local_a0,&local_b8);
    ByteData256::GetData(__return_storage_ptr__,&local_a0);
    ByteData256::~ByteData256(&local_a0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8);
    break;
  case '\x04':
    ByteData::GetBytes(&local_e8,&this->buffer_);
    Sha256D(&local_d0,&local_e8);
    ByteData256::GetData(__return_storage_ptr__,&local_d0);
    ByteData256::~ByteData256(&local_d0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_e8);
    break;
  case '\x05':
    ByteData::GetBytes(&local_100,&this->buffer_);
    Sha512(__return_storage_ptr__,&local_100);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_100);
    break;
  default:
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_120,"unknown hash type.",&local_121);
    CfdException::CfdException(this_00,kCfdInternalError,&local_120);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData HashUtil::Output() {
  switch (hash_type_) {
    case kRipemd160:
      return Ripemd160(buffer_.GetBytes()).GetData();
    case kHash160:
      return Hash160(buffer_.GetBytes()).GetData();
    case kSha256:
      return Sha256(buffer_.GetBytes()).GetData();
    case kSha256D:
      return Sha256D(buffer_.GetBytes()).GetData();
    case kSha512:
      return Sha512(buffer_.GetBytes());
    default:
      throw CfdException(kCfdInternalError, "unknown hash type.");
  }
}